

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeCallback.cc
# Opt level: O2

int __thiscall flow::NativeCallback::findParamByName(NativeCallback *this,string *name)

{
  pointer pbVar1;
  pointer pbVar2;
  __type_conflict2 _Var3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  
  pbVar1 = (this->names_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar2 = (this->names_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = 0;
  iVar6 = 0;
  while ((iVar4 = -1, ((long)pbVar1 - (long)pbVar2 & 0x1fffffffe0U) != uVar5 &&
         (_Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&(((this->names_).
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             _M_dataplus)._M_p + uVar5),name), iVar4 = iVar6, !_Var3
         ))) {
    iVar6 = iVar6 + 1;
    uVar5 = uVar5 + 0x20;
  }
  return iVar4;
}

Assistant:

int NativeCallback::findParamByName(const std::string& name) const {
  for (int i = 0, e = names_.size(); i != e; ++i)
    if (names_[i] == name)
      return i;

  return -1;
}